

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O3

float32 float32_div_mips(float32 a,float32 b,float_status *s)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  byte bVar3;
  uint uVar4;
  long lVar5;
  union_float32 ub;
  ulong uVar6;
  union_float32 ua;
  ulong uVar7;
  uint uVar8;
  ulong uVar9;
  uint64_t uVar10;
  ulong uVar11;
  ulong uVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  float fVar17;
  FloatParts b_00;
  FloatParts FVar18;
  FloatParts FVar19;
  FloatParts p;
  
  uVar9 = (ulong)a;
  bVar3 = s->float_exception_flags;
  if (((bVar3 & 0x20) != 0) && (s->float_rounding_mode == '\0')) {
    if (s->flush_inputs_to_zero != '\0') {
      bVar13 = (a & 0x7f800000) == 0;
      bVar14 = (a & 0x7fffffff) != 0;
      if (bVar14 && bVar13) {
        uVar9 = (ulong)(a & 0x80000000);
        bVar3 = bVar3 | 0x40;
      }
      bVar15 = (b & 0x7f800000) == 0;
      bVar16 = (b & 0x7fffffff) != 0;
      if (bVar16 && bVar15) {
        b = b & 0x80000000;
        bVar3 = bVar3 | 0x40;
      }
      if (bVar14 && bVar13 || bVar16 && bVar15) {
        s->float_exception_flags = bVar3;
      }
    }
    if ((((uVar9 & 0x7fffffff) == 0) || (((int)(uVar9 >> 0x17) + 1U & 0xfe) != 0)) &&
       (((b >> 0x17) + 1 & 0xfe) != 0)) {
      fVar17 = (float)uVar9 / (float)b;
      if (ABS(fVar17) == INFINITY) {
        s->float_exception_flags = bVar3 | 8;
        return (float32)fVar17;
      }
      if ((1.1754944e-38 < ABS(fVar17)) || ((uVar9 & 0x7fffffff) == 0)) {
        return (float32)fVar17;
      }
    }
  }
  FVar18._8_8_ = (ulong)((uint)(uVar9 >> 0x17) & 0xff) | (ulong)((uint)uVar9 & 0x80000000) << 9;
  FVar18.frac = (ulong)((uint)uVar9 & 0x7fffff);
  FVar18 = sf_canonicalize(FVar18,&float32_params,s);
  uVar11 = FVar18._8_8_;
  uVar9 = FVar18.frac;
  FVar19._8_8_ = (ulong)(b >> 0x17 & 0xff) | (ulong)(b & 0x80000000) << 9;
  FVar19.frac = (ulong)(b & 0x7fffff);
  FVar19 = sf_canonicalize(FVar19,&float32_params,s);
  uVar6 = FVar19._8_8_;
  uVar12 = FVar19.frac;
  uVar7 = (uVar6 ^ uVar11) & 0x10000000000;
  uVar8 = FVar18._12_4_ & 0xff;
  uVar4 = FVar19._12_4_ & 0xff;
  if ((uVar8 == 2) && (uVar4 == 2)) {
    uVar6 = (ulong)((FVar18.exp - FVar19.exp) - (uint)(uVar9 < uVar12));
    lVar5 = 0;
    if (uVar12 <= uVar9) {
      lVar5 = uVar9 << 0x3f;
    }
    auVar1._8_8_ = 0;
    auVar1._0_8_ = uVar12 * 2;
    auVar2._8_8_ = uVar9 >> (uVar12 <= uVar9);
    auVar2._0_8_ = lVar5;
    uVar9 = (ulong)(SUB168(auVar2 % auVar1,0) != 0) | SUB168(auVar2 / auVar1,0);
    uVar11 = uVar11 & 0xffff00ff00000000;
  }
  else {
    if (((uVar11 | uVar6) & 0xfc00000000) != 0) {
      b_00._8_8_ = uVar6 & 0xffffffffffff;
      b_00.frac = uVar12;
      p = pick_nan(FVar18,b_00,s);
      goto LAB_00719e7c;
    }
    if (((uVar11 >> 0x20 & 1) != 0) && (uVar8 == uVar4)) {
      s->float_exception_flags = s->float_exception_flags | 1;
      uVar10 = 0x2000000000000000;
      if (s->snan_bit_is_one != '\0') {
        uVar10 = 0x1fffffffffffffff;
      }
      p.exp = 0x7fffffff;
      p.cls = float_class_qnan;
      p.sign = false;
      p._14_2_ = 0;
      p.frac = uVar10;
      goto LAB_00719e7c;
    }
    if ((uVar11 >> 0x20 & 1) != 0) {
      uVar7 = uVar7 | uVar11 & 0xffff0003ffffffff;
      p.exp = (int)uVar7;
      p.cls = (char)(uVar7 >> 0x20);
      p.sign = (_Bool)(char)(uVar7 >> 0x28);
      p._14_2_ = (short)(uVar7 >> 0x30);
      p.frac = uVar9;
      goto LAB_00719e7c;
    }
    if (uVar4 == 3) {
      uVar12 = uVar11 & 0xffff0000ffffffff | uVar7 | 0x100000000;
      p.exp = (int)uVar12;
      p.cls = (char)(uVar12 >> 0x20);
      p.sign = (_Bool)(char)(uVar12 >> 0x28);
      p._14_2_ = (short)(uVar12 >> 0x30);
      p.frac = uVar9;
      goto LAB_00719e7c;
    }
    if (uVar4 != 1) {
      g_assertion_message_expr
                ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/fpu/softfloat.c"
                 ,0x702,(char *)0x0);
    }
    s->float_exception_flags = s->float_exception_flags | 4;
    uVar11 = uVar11 & 0xffff0000ffffffff;
    uVar6 = 0x300000000;
  }
  uVar7 = uVar6 | uVar11 | uVar7;
  p.exp = (int)uVar7;
  p.cls = (char)(uVar7 >> 0x20);
  p.sign = (_Bool)(char)(uVar7 >> 0x28);
  p._14_2_ = (short)(uVar7 >> 0x30);
  p.frac = uVar9;
LAB_00719e7c:
  FVar18 = round_canonical(p,s,&float32_params);
  return (uint)FVar18.frac & 0x7fffff | (FVar18.exp & 0xffU) << 0x17 |
         (uint)(FVar18._8_8_ >> 9) & 0x80000000;
}

Assistant:

static inline bool can_use_fpu(const float_status *s)
{
    if (QEMU_NO_HARDFLOAT) {
        return false;
    }
    return likely(s->float_exception_flags & float_flag_inexact &&
                  s->float_rounding_mode == float_round_nearest_even);
}